

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::render
               (TestLog *log,RenderContext *renderContext,RenderBits renderBits,Random *rng,
               ShaderProgram *program,TextureBuffer *texture,PixelBufferAccess *target)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_a8;
  deUint32 local_a4;
  int maxTextureBufferSize;
  deUint32 coordSeed;
  int triangleCount;
  allocator<char> local_61;
  string local_60;
  ScopedLogSection local_40;
  ScopedLogSection renderSection;
  TextureBuffer *texture_local;
  ShaderProgram *program_local;
  Random *rng_local;
  RenderBits renderBits_local;
  RenderContext *renderContext_local;
  TestLog *log_local;
  
  renderSection.m_log = (TestLog *)texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Render Texture buffer",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&triangleCount,"Render Texture Buffer",
             (allocator<char> *)((long)&coordSeed + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_40,log,&local_60,(string *)&triangleCount);
  std::__cxx11::string::~string((string *)&triangleCount);
  std::allocator<char>::~allocator((allocator<char> *)((long)&coordSeed + 3));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  maxTextureBufferSize = 8;
  local_a4 = de::Random::getUint32(rng);
  local_a8 = 0;
  iVar1 = (*renderContext->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8c2b,&local_a8);
  iVar1 = (*renderContext->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(err,"query GL_MAX_TEXTURE_BUFFER_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x303);
  logRendering(log,renderBits);
  renderGL(renderContext,renderBits,local_a4,8,program,(TextureBuffer *)renderSection.m_log);
  renderReference(renderBits,local_a4,8,(TextureBuffer *)renderSection.m_log,local_a8,target);
  tcu::ScopedLogSection::~ScopedLogSection(&local_40);
  return;
}

Assistant:

void render (TestLog&						log,
			 glu::RenderContext&			renderContext,
			 RenderBits						renderBits,
			 de::Random&					rng,
			 glu::ShaderProgram&			program,
			 glu::TextureBuffer&			texture,
			 const tcu::PixelBufferAccess&	target)
{
	const tcu::ScopedLogSection	renderSection			(log, "Render Texture buffer", "Render Texture Buffer");
	const int					triangleCount			= 8;
	const deUint32				coordSeed				= rng.getUint32();
	int							maxTextureBufferSize	= 0;

	renderContext.getFunctions().getIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE, &maxTextureBufferSize);
	GLU_EXPECT_NO_ERROR(renderContext.getFunctions().getError(), "query GL_MAX_TEXTURE_BUFFER_SIZE");
	DE_ASSERT(maxTextureBufferSize > 0); // checked in init()

	logRendering(log, renderBits);

	renderGL(renderContext, renderBits, coordSeed, triangleCount, program, texture);
	renderReference(renderBits, coordSeed, triangleCount, texture, maxTextureBufferSize, target);
}